

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void google::protobuf::TextFormat::OutOfLinePrintString<char[16]>
               (BaseTextGenerator *generator,char (*values) [16])

{
  size_t sVar1;
  long *local_40;
  undefined8 local_38;
  long local_30 [2];
  
  sVar1 = strlen(*values);
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,values,*values + sVar1);
  (*generator->_vptr_BaseTextGenerator[5])(generator,local_40,local_38);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return;
}

Assistant:

PROTOBUF_NOINLINE void TextFormat::OutOfLinePrintString(
    BaseTextGenerator* generator, const T&... values) {
  generator->PrintString(absl::StrCat(values...));
}